

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int match_class(int c,int cl)

{
  int iVar1;
  uint uVar2;
  ushort **ppuVar3;
  uint uVar4;
  
  iVar1 = tolower(cl);
  switch(iVar1) {
  case 0x61:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x400;
    break;
  default:
    return (uint)(cl == c);
  case 99:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 2;
    break;
  case 100:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x800;
    break;
  case 0x67:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x8000;
    break;
  case 0x6c:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x200;
    break;
  case 0x70:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 4;
    break;
  case 0x73:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x2000;
    break;
  case 0x75:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x100;
    break;
  case 0x77:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 8;
    break;
  case 0x78:
    ppuVar3 = __ctype_b_loc();
    uVar4 = (*ppuVar3)[(uint)c] & 0x1000;
    break;
  case 0x7a:
    uVar4 = (uint)(c == 0);
  }
  ppuVar3 = __ctype_b_loc();
  uVar2 = (uint)(uVar4 == 0);
  if ((*(byte *)((long)*ppuVar3 + (ulong)(uint)cl * 2 + 1) & 2) != 0) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

static int match_class(int c, int cl) {
    int res;
    switch (tolower(cl)) {
        case 'a' :
            res = isalpha(c);
            break;
        case 'c' :
            res = iscntrl(c);
            break;
        case 'd' :
            res = isdigit(c);
            break;
        case 'g' :
            res = isgraph(c);
            break;
        case 'l' :
            res = islower(c);
            break;
        case 'p' :
            res = ispunct(c);
            break;
        case 's' :
            res = isspace(c);
            break;
        case 'u' :
            res = isupper(c);
            break;
        case 'w' :
            res = isalnum(c);
            break;
        case 'x' :
            res = isxdigit(c);
            break;
        case 'z' :
            res = (c == 0);
            break;  /* deprecated option */
        default:
            return (cl == c);
    }
    return (islower(cl) ? res : !res);
}